

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O2

void Gia_ManCofOneDerive_rec(Ccf_Man_t *p,int Id)

{
  ulong uVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  uint uVar5;
  
  iVar2 = Vec_IntEntry(p->vCopies,Id);
  if (iVar2 == -1) {
    pObj = Gia_ManObj(p->pFrames,Id);
    uVar1 = *(ulong *)pObj;
    uVar4 = (uint)uVar1;
    uVar5 = (uint)(uVar1 >> 0x20);
    if ((~uVar4 & 0x9fffffff) == 0) {
      if ((int)(uVar5 & 0x1fffffff) < p->pGia->nRegs) {
        if (Id < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar4 = Id * 2;
      }
      else {
        if ((Id < 0) || (p->pSat->size <= Id)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                        ,0xcd,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar4 = (uint)(p->pSat->model[(uint)Id] == 1);
      }
    }
    else {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCCof.c"
                      ,0xa0,"void Gia_ManCofOneDerive_rec(Ccf_Man_t *, int)");
      }
      iVar2 = Gia_ObjId(p->pFrames,pObj);
      iVar2 = iVar2 - (*(uint *)pObj & 0x1fffffff);
      iVar3 = Gia_ObjId(p->pFrames,pObj);
      iVar3 = iVar3 - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
      Gia_ManCofOneDerive_rec(p,iVar2);
      Gia_ManCofOneDerive_rec(p,iVar3);
      p_00 = p->pFrames;
      iVar2 = Vec_IntEntry(p->vCopies,iVar2);
      iVar2 = Abc_LitNotCond(iVar2,(uint)(uVar1 >> 0x1d) & 1);
      iVar3 = Vec_IntEntry(p->vCopies,iVar3);
      iVar3 = Abc_LitNotCond(iVar3,uVar5 >> 0x1d & 1);
      uVar4 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      if (Id < 0) goto LAB_0053fb59;
    }
    if (p->vCopies->nSize <= Id) {
LAB_0053fb59:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p->vCopies->pArray[(uint)Id] = uVar4;
  }
  return;
}

Assistant:

void Gia_ManCofOneDerive_rec( Ccf_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int Res;
    if ( Vec_IntEntry(p->vCopies, Id) != -1 )
        return;
    pObj = Gia_ManObj(p->pFrames, Id);
    assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fCompl0 = Gia_ObjFaninC0(pObj);
        int fCompl1 = Gia_ObjFaninC1(pObj);
        int Fan0 = Gia_ObjFaninId0p(p->pFrames, pObj);
        int Fan1 = Gia_ObjFaninId1p(p->pFrames, pObj);
        Gia_ManCofOneDerive_rec( p, Fan0 );
        Gia_ManCofOneDerive_rec( p, Fan1 );
        Res = Gia_ManHashAnd( p->pFrames, 
            Gia_Obj0Copy(p->vCopies, Fan0, fCompl0), 
            Gia_Obj1Copy(p->vCopies, Fan1, fCompl1) );
    }
    else if ( Gia_ObjCioId(pObj) >= Gia_ManRegNum(p->pGia) ) // PI
        Res = sat_solver_var_value( p->pSat, Id );
    else
        Res = Abc_Var2Lit( Id, 0 );
    Vec_IntWriteEntry( p->vCopies, Id, Res );
}